

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CCtx_params * ZSTD_createCCtxParams(void)

{
  ZSTD_customMem customMem;
  ZSTD_CCtx_params *pZVar1;
  
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  pZVar1 = (ZSTD_CCtx_params *)ZSTD_calloc(0x78,customMem);
  if (pZVar1 != (ZSTD_CCtx_params *)0x0) {
    (pZVar1->customMem).opaque = (void *)0x0;
    (pZVar1->customMem).customAlloc = (ZSTD_allocFunction)0x0;
    (pZVar1->customMem).customFree = (ZSTD_freeFunction)0x0;
    pZVar1->compressionLevel = 3;
    (pZVar1->fParams).contentSizeFlag = 1;
  }
  return pZVar1;
}

Assistant:

ZSTD_CCtx_params* ZSTD_createCCtxParams(void)
{
    return ZSTD_createCCtxParams_advanced(ZSTD_defaultCMem);
}